

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoConvert<unsigned_long,double>(Thread *this,Ptr *out_trap)

{
  double dVar1;
  
  dVar1 = Pop<double>(this);
  if (NAN(dVar1)) {
    DoConvert<unsigned_long,double>();
  }
  else {
    if ((-1.0 < dVar1) && (dVar1 < 1.8446744073709552e+19)) {
      Push<unsigned_long>(this,(long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f |
                               (long)dVar1);
      return Ok;
    }
    DoConvert<unsigned_long,double>();
  }
  return Trap;
}

Assistant:

RunResult Thread::DoConvert(Trap::Ptr* out_trap) {
  auto val = Pop<T>();
  if (std::is_integral<R>::value && std::is_floating_point<T>::value) {
    // Don't use std::isnan here because T may be a non-floating-point type.
    TRAP_IF(IsNaN(val), "invalid conversion to integer");
  }
  TRAP_UNLESS(CanConvert<R>(val), "integer overflow");
  Push<R>(Convert<R>(val));
  return RunResult::Ok;
}